

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O0

bool __thiscall
S2PolylineSimplifier::TargetDisc(S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r)

{
  bool bVar1;
  double margin;
  S1Interval SVar2;
  VType local_80;
  VType local_78;
  S1Interval local_70;
  undefined1 local_60 [8];
  S1Interval target;
  double center;
  VType local_40;
  double semiwidth;
  S2Point *p_local;
  S2PolylineSimplifier *this_local;
  S1ChordAngle r_local;
  
  margin = GetSemiwidth(this,p,r,-1);
  if (margin < 3.141592653589793) {
    if (0.0 <= margin) {
      target.bounds_.c_[1] = GetAngle(this,p);
      local_70 = S1Interval::FromPoint(target.bounds_.c_[1]);
      _local_60 = S1Interval::Expanded(&local_70,margin);
      SVar2 = S1Interval::Intersection(&this->window_,(S1Interval *)local_60);
      local_80 = SVar2.bounds_.c_[0];
      (this->window_).bounds_.c_[0] = local_80;
      local_78 = SVar2.bounds_.c_[1];
      (this->window_).bounds_.c_[1] = local_78;
      bVar1 = S1Interval::is_empty(&this->window_);
      r_local.length2_._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      SVar2 = S1Interval::Empty();
      center = SVar2.bounds_.c_[0];
      (this->window_).bounds_.c_[0] = center;
      local_40 = SVar2.bounds_.c_[1];
      (this->window_).bounds_.c_[1] = local_40;
      r_local.length2_._7_1_ = false;
    }
  }
  else {
    r_local.length2_._7_1_ = true;
  }
  return r_local.length2_._7_1_;
}

Assistant:

bool S2PolylineSimplifier::TargetDisc(const S2Point& p, S1ChordAngle r) {
  // Shrink the target interval by the maximum error from all sources.  This
  // guarantees that the output edge will intersect the given disc.
  double semiwidth = GetSemiwidth(p, r, -1 /*round down*/);
  if (semiwidth >= M_PI) {
    // The target disc contains "src", so there is nothing to do.
    return true;
  }
  if (semiwidth < 0) {
    window_ = S1Interval::Empty();
    return false;
  }
  // Otherwise compute the angle interval corresponding to the target disc and
  // intersect it with the current window.
  double center = GetAngle(p);
  S1Interval target = S1Interval::FromPoint(center).Expanded(semiwidth);
  window_ = window_.Intersection(target);
  return !window_.is_empty();
}